

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O1

ConstIterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator++
          (ConstIterator *this)

{
  size_t sVar1;
  ulong uVar2;
  
  if (-1 < this->m_index) {
    uVar2 = (ulong)(uint)this->m_index + 1;
    this->m_index = (int)uVar2;
    sVar1 = VectorDynSize::size(&this->m_matrix->m_values);
    if (uVar2 < sVar1) {
      updateTriplet(this);
    }
    else {
      this->m_index = -1;
    }
  }
  return this;
}

Assistant:

typename SparseMatrix<ordering>::ConstIterator& SparseMatrix<ordering>::ConstIterator::operator++()
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        m_index++;
        if (static_cast<std::size_t>(m_index) >= m_matrix.m_values.size()) {
            //Out of range
            m_index = -1;
        } else {
            updateTriplet();
        }

        return *this;
    }